

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

string * __thiscall
LexicalAnalyzer::categorize(string *__return_storage_ptr__,LexicalAnalyzer *this,string *word)

{
  bool bVar1;
  mapped_type *pmVar2;
  long lVar3;
  allocator local_c5;
  allocator local_c4;
  allocator local_c3;
  allocator local_c2;
  allocator local_c1;
  undefined4 local_c0;
  allocator local_b9;
  undefined1 local_b8 [8];
  regex pattern_num;
  regex pattern_del;
  regex pattern_op;
  regex pattern_id;
  allocator local_21;
  string *local_20;
  string *word_local;
  LexicalAnalyzer *this_local;
  
  local_20 = word;
  word_local = &this->source;
  this_local = (LexicalAnalyzer *)__return_storage_ptr__;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->KEYWORD,word);
  if ((*pmVar2 & 1U) == 0) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &pattern_op._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"[_a-zA-Z]\\w{0,63}",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &pattern_del._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"\\+|-|\\/|\\*|=|==|<|<=|>|>=|!=",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &pattern_num._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"\\(|\\)|\\{|\\}|\\;|\\,",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b8,
               "[0-9]+|\\.[0-9]+|[Ee][+-]{0,1}[0-9]+|[0-9]+[Ee][+-]{0,1}[0-9]+|[0-9]+\\.[0-9]+([Ee][+-]{0,1}[0-9]+){0,1}"
               ,0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (local_20,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                &pattern_op._M_automaton.
                                 super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"identifier",&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    else {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (local_20,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                  &pattern_del._M_automaton.
                                   super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount,0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"operator",&local_c1);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (local_20,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                    &pattern_num._M_automaton.
                                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,0);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"delimiter",&local_c2);
          std::allocator<char>::~allocator((allocator<char> *)&local_c2);
        }
        else {
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (local_20,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                      local_b8,0);
          if (bVar1) {
            lVar3 = std::__cxx11::string::find((char)local_20,0x2e);
            if (lVar3 == -1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_c4);
              std::allocator<char>::~allocator((allocator<char> *)&local_c4);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,"real",&local_c3);
              std::allocator<char>::~allocator((allocator<char> *)&local_c3);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,"error",&local_c5);
            std::allocator<char>::~allocator((allocator<char> *)&local_c5);
          }
        }
      }
    }
    local_c0 = 1;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b8);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &pattern_num._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &pattern_del._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &pattern_op._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"keyword",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LexicalAnalyzer::categorize(std::string &word) {
    if (KEYWORD[word]) {//keyword
        return "keyword";
    }
    //identifier
    std::regex pattern_id("[_a-zA-Z]\\w{0,63}");
    std::regex pattern_op("\\+|-|\\/|\\*|=|==|<|<=|>|>=|!=");
    std::regex pattern_del("\\(|\\)|\\{|\\}|\\;|\\,");
    std::regex pattern_num(
            "[0-9]+|\\.[0-9]+|[Ee][+-]{0,1}[0-9]+|[0-9]+[Ee][+-]{0,1}[0-9]+|[0-9]+\\.[0-9]+([Ee][+-]{0,1}[0-9]+){0,1}");
    if (std::regex_match(word, pattern_id)) {
        return "identifier";
    }
    if (std::regex_match(word, pattern_op)) {
        return "operator";
    }
    if (std::regex_match(word, pattern_del)) {
        return "delimiter";
    }
    if (std::regex_match(word, pattern_num)) {
        if(word.find('.')!=std::string::npos)
            return "real";
        else
            return "int";
    }
    return "error";
}